

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaConfig.cpp
# Opt level: O0

void __thiscall
NaConfigFile::NaConfigFile
          (NaConfigFile *this,char *szMagic,uint nMajorVerNo,uint nMinorVerNo,char *szFileExt,
          char *szMarks)

{
  undefined4 *puVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *in_R8;
  char *in_R9;
  uint *in_stack_ffffffffffffff98;
  NaDataStream *in_stack_ffffffffffffffa0;
  
  *in_RDI = &PTR__NaConfigFile_00193f40;
  NaDataStream::NaDataStream(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RDI = &PTR__NaConfigFile_00193f40;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  in_RDI[0xc] = 0;
  NaDynAr<NaCPRegItem>::NaDynAr((NaDynAr<NaCPRegItem> *)(in_RDI + 0xd));
  in_RDI[0x11] = 0;
  if (((in_RSI != (char *)0x0) && (in_R8 != (char *)0x0)) && (in_R9 != (char *)0x0)) {
    sVar2 = strlen(in_RSI);
    pvVar3 = operator_new__(sVar2 + 1);
    in_RDI[3] = pvVar3;
    strcpy((char *)in_RDI[3],in_RSI);
    sVar2 = strlen(in_R8);
    pvVar3 = operator_new__(sVar2 + 1);
    in_RDI[4] = pvVar3;
    strcpy((char *)in_RDI[4],in_R8);
    sVar2 = strlen(in_R9);
    pvVar3 = operator_new__(sVar2 + 1);
    in_RDI[5] = pvVar3;
    strcpy((char *)in_RDI[5],in_R9);
    in_RDI[6] = in_RDI[5];
    pcVar4 = strchr((char *)in_RDI[6],0x20);
    in_RDI[7] = pcVar4 + 1;
    pcVar4 = strchr((char *)in_RDI[7],0x20);
    in_RDI[8] = pcVar4 + 1;
    *(undefined1 *)(in_RDI[7] + -1) = 0;
    *(undefined1 *)(in_RDI[8] + -1) = 0;
    *(undefined4 *)(in_RDI + 9) = in_EDX;
    *(undefined4 *)(in_RDI + 10) = in_EDX;
    *(undefined4 *)((long)in_RDI + 0x4c) = in_ECX;
    *(undefined4 *)((long)in_RDI + 0x54) = in_ECX;
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

NaConfigFile::NaConfigFile (const char* szMagic,
                            unsigned nMajorVerNo,
                            unsigned nMinorVerNo,
                            const char* szFileExt,
                            const char* szMarks)
: NaDataStream(nFileVer), nPartList(0), pPartList(NULL), fp(NULL)
{
    if(NULL == szMagic || NULL == szFileExt || NULL == szMarks)
        throw(na_null_pointer);

    szMagicString = new char[strlen(szMagic) + 1];
    strcpy(szMagicString, szMagic);

    szFileExtString = new char[strlen(szFileExt) + 1];
    strcpy(szFileExtString, szFileExt);

    szMarksBuf = new char[strlen(szMarks) + 1];
    strcpy(szMarksBuf, szMarks);

    szTitleStartMark = szMarksBuf;
    szTitleEndMark = 1 + strchr(szTitleStartMark, ' ');
    szCommentMark = 1 + strchr(szTitleEndMark, ' ');

    szTitleEndMark[-1] = '\0';
    szCommentMark[-1] = '\0';

    nFileVer[NaMajorVerNo] = nVer[NaMajorVerNo] = nMajorVerNo;
    nFileVer[NaMinorVerNo] = nVer[NaMinorVerNo] = nMinorVerNo;
}